

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O1

void __thiscall VmModule::VmModule(VmModule *this,Allocator *allocator,char *code)

{
  LoopInfo *__s;
  undefined8 *puVar1;
  long lVar2;
  
  this->code = code;
  (this->functions).head = (VmFunction *)0x0;
  (this->functions).tail = (VmFunction *)0x0;
  __s = (this->loopInfo).little;
  memset(__s,0,0x200);
  (this->loopInfo).allocator = allocator;
  (this->loopInfo).data = __s;
  (this->loopInfo).count = 0;
  (this->loopInfo).max = 0x20;
  lVar2 = 0x2a0;
  do {
    puVar1 = (undefined8 *)((long)(this->loopInfo).little + lVar2 + -0x5c);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->loopInfo).little + lVar2 + -0x68);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->loopInfo).little + lVar2 + -0x48);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->loopInfo).little + lVar2 + -0x38);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->loopInfo).little + lVar2 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined2 *)((long)(this->loopInfo).little + lVar2 + -0x18) = 0;
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0xda0);
  (this->loadStoreInfo).allocator = allocator;
  (this->loadStoreInfo).data = (this->loadStoreInfo).little;
  (this->loadStoreInfo).count = 0;
  (this->loadStoreInfo).max = 0x20;
  (this->tempUsers).allocator = allocator;
  (this->tempUsers).data = (this->tempUsers).little;
  (this->tempUsers).count = 0;
  (this->tempUsers).max = 0x80;
  (this->tempInstructions).allocator = allocator;
  (this->tempInstructions).data = (this->tempInstructions).little;
  (this->tempInstructions).count = 0;
  (this->tempInstructions).max = 0x80;
  this->allocator = allocator;
  this->vmGlobalCodeStart = 0;
  this->regVmGlobalCodeStart = 0;
  this->skipFunctionDefinitions = false;
  this->currentFunction = (VmFunction *)0x0;
  this->currentBlock = (VmBlock *)0x0;
  this->peepholeOptimizations = 0;
  this->constantPropagations = 0;
  this->deadCodeEliminations = 0;
  this->controlFlowSimplifications = 0;
  this->loadStorePropagations = 0;
  this->commonSubexprEliminations = 0;
  this->deadAllocaStoreEliminations = 0;
  this->functionInlines = 0;
  return;
}

Assistant:

VmModule(Allocator *allocator, const char *code): code(code), loopInfo(allocator), loadStoreInfo(allocator), tempUsers(allocator), tempInstructions(allocator), allocator(allocator)
	{
		vmGlobalCodeStart = 0;
		regVmGlobalCodeStart = 0;

		skipFunctionDefinitions = false;

		currentFunction = NULL;
		currentBlock = NULL;

		peepholeOptimizations = 0;
		constantPropagations = 0;
		deadCodeEliminations = 0;
		controlFlowSimplifications = 0;
		loadStorePropagations = 0;
		commonSubexprEliminations = 0;
		deadAllocaStoreEliminations = 0;
		functionInlines = 0;
	}